

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O1

void all_different_imp(BoolView *b,vec<IntVar_*> *x,ConLevel cl)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  IntView<4> *__ptr;
  undefined8 uVar5;
  vec<IntView<4>_> *pvVar6;
  AllDiffBoundsImp<4> *this;
  AllDiffBoundsImp<0> *this_00;
  long lVar7;
  undefined8 extraout_RAX;
  int iVar8;
  int iVar9;
  ulong uVar10;
  vec<IntView<0>_> u;
  vec<IntView<0>_> local_98;
  vec<IntView<0>_> local_88;
  BoolView *local_78;
  vec<IntView<4>_> local_70;
  BoolView local_60;
  BoolView local_50;
  IntView<0> local_40;
  
  if ((ulong)x->sz == 0) {
    iVar8 = -0x7fffffff;
    iVar9 = 0x7fffffff;
  }
  else {
    iVar8 = -0x80000000;
    iVar9 = 0x7fffffff;
    uVar10 = 0;
    do {
      iVar3 = (x->data[uVar10]->min).v;
      iVar4 = (x->data[uVar10]->max).v;
      if (iVar3 < iVar9) {
        iVar9 = iVar3;
      }
      if (iVar8 < iVar4) {
        iVar8 = iVar4;
      }
      uVar10 = uVar10 + 1;
    } while (x->sz != uVar10);
    iVar8 = iVar8 + 1;
  }
  local_78 = b;
  if ((cl & ~CL_BND) == CL_DEF) {
    local_88.sz = 0;
    local_88.cap = 0;
    local_88.data = (IntView<0> *)0x0;
    if (x->sz != 0) {
      uVar10 = 0;
      do {
        local_40.var = x->data[uVar10];
        local_40.a = 1;
        local_40.b = -iVar9;
        vec<IntView<0>_>::push(&local_88,&local_40);
        uVar10 = uVar10 + 1;
      } while (uVar10 < x->sz);
    }
    if (iVar9 == 0) {
      this_00 = (AllDiffBoundsImp<0> *)operator_new(0x88);
      local_50.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_50.v = local_78->v;
      local_50.s = local_78->s;
      uVar10 = local_88._0_8_ & 0xffffffff;
      local_98.sz = local_88.sz;
      local_98.cap = local_88.sz;
      local_98.data = (IntView<0> *)malloc(uVar10 << 4);
      if (uVar10 != 0) {
        lVar7 = 0;
        uVar10 = 0;
        do {
          puVar1 = (undefined8 *)((long)&(local_88.data)->var + lVar7);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&(local_98.data)->var + lVar7);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          uVar10 = uVar10 + 1;
          lVar7 = lVar7 + 0x10;
        } while (uVar10 < local_98.sz);
      }
      AllDiffBoundsImp<0>::AllDiffBoundsImp(this_00,&local_50,&local_98,iVar8 - iVar9);
      pvVar6 = (vec<IntView<4>_> *)&local_98;
    }
    else {
      this = (AllDiffBoundsImp<4> *)operator_new(0x88);
      local_60.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_60.v = local_78->v;
      local_60.s = local_78->s;
      vec<IntView<4>>::vec<IntView<0>>((vec<IntView<4>> *)&local_70,&local_88);
      AllDiffBoundsImp<4>::AllDiffBoundsImp(this,&local_60,&local_70,iVar8 - iVar9);
      pvVar6 = &local_70;
    }
    __ptr = pvVar6->data;
    if (__ptr != (IntView<4> *)0x0) {
      free(__ptr);
    }
    pvVar6->data = (IntView<4> *)0x0;
    if (local_88.data != (IntView<0> *)0x0) {
      free(local_88.data);
    }
    return;
  }
  all_different_imp();
  if (local_98.data != (IntView<0> *)0x0) {
    free(local_98.data);
  }
  local_98.data = (IntView<0> *)0x0;
  operator_delete(x);
  if (local_88.data != (IntView<0> *)0x0) {
    free(local_88.data);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void all_different_imp(const BoolView& b, vec<IntVar*>& x, ConLevel cl) {
	int min = INT_MAX;
	int max = INT_MIN;
	for (unsigned int i = 0; i < x.size(); i++) {
		if (x[i]->getMin() < min) {
			min = x[i]->getMin();
		}
		if (x[i]->getMax() > max) {
			max = x[i]->getMax();
		}
	}
	const int range = max + 1 - min;
	if (!(cl == CL_BND || cl == CL_DEF)) {
		NOT_SUPPORTED;
	}
	vec<IntView<> > u;
	for (unsigned int i = 0; i < x.size(); i++) {
		u.push(IntView<>(x[i], 1, -min));
	}
	if (min == 0) {
		new AllDiffBoundsImp<0>(b, u, range);
	} else {
		new AllDiffBoundsImp<4>(b, u, range);
	}
}